

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inquire.cpp
# Opt level: O0

bool fs_is_readable(string_view path)

{
  bool bVar1;
  perms pVar2;
  perms pVar3;
  perms others_read;
  perms group_read;
  perms owner_read;
  perms none;
  path local_60;
  undefined8 local_38;
  file_status s;
  error_code ec;
  string_view path_local;
  
  ec._M_cat = (error_category *)path._M_len;
  std::error_code::error_code((error_code *)&s);
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_60,(basic_string_view<char,_std::char_traits<char>_> *)&ec._M_cat,auto_format);
  local_38 = std::filesystem::status(&local_60,(error_code *)&s);
  std::filesystem::__cxx11::path::~path(&local_60);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&s);
  if ((!bVar1) && (bVar1 = std::filesystem::exists(local_38), bVar1)) {
    pVar2 = std::filesystem::file_status::permissions((file_status *)&local_38);
    pVar3 = std::filesystem::operator|(owner_read,group_read);
    pVar3 = std::filesystem::operator|(pVar3,others_read);
    pVar2 = std::filesystem::operator&(pVar2,pVar3);
    return pVar2 != none;
  }
  return false;
}

Assistant:

bool fs_is_readable(std::string_view path)
{
  // is directory or file readable by the user

#if defined(_WIN32)
  // MSVC / MinGW ::perms doesn't detect App Execution Aliases readability
  // otherwise ::filesystem works for Windows ::perms,
  // but to be most efficient and deduplicate code, we implement like this.
  // https://learn.microsoft.com/en-us/cpp/c-runtime-library/reference/access-s-waccess-s
  return _access_s(path.data(), 4) == 0;

#elif defined(HAVE_CXX_FILESYSTEM)

  std::error_code ec;
  const auto s = std::filesystem::status(path, ec);

  if(ec || !std::filesystem::exists(s))
    return false;

#if defined(__cpp_using_enum)  // C++20
  using enum std::filesystem::perms;
#else
  constexpr std::filesystem::perms none = std::filesystem::perms::none;
  constexpr std::filesystem::perms owner_read = std::filesystem::perms::owner_read;
  constexpr std::filesystem::perms group_read = std::filesystem::perms::group_read;
  constexpr std::filesystem::perms others_read = std::filesystem::perms::others_read;
#endif

  return (s.permissions() & (owner_read | group_read | others_read)) != none;

#else
  return !access(path.data(), R_OK);
#endif
}